

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>
          (PrimInfo *__return_storage_ptr__,avx *this,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  TriangleSplitterFactory *pTVar3;
  undefined1 *puVar4;
  size_t *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  runtime_error *prVar12;
  ulong uVar13;
  ulong uVar14;
  size_t i;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined7 in_register_00000081;
  size_t N;
  ulong uVar20;
  size_t *psVar21;
  ulong uVar22;
  anon_class_8_1_a89d07ac *in_stack_ffffffffffffd178;
  size_t taskCount_1;
  avx *local_2e70;
  size_t local_2e68;
  TriangleSplitterFactory local_2e60;
  size_t taskCount;
  Scene *local_2e50;
  anon_class_8_1_78f12065 split_primitive;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2e18;
  size_t local_2e08;
  size_t sStack_2e00;
  Scene *scene_local;
  PrimInfo pinfo;
  TriangleSplitterFactory Splitter;
  anon_class_8_1_a89d07ac primitiveArea;
  undefined8 uStack_2d00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2cf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2ce8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2cd8;
  undefined1 local_2cc8 [16];
  Iterator2 iter;
  undefined8 local_2c98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_2c90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_2c80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_2c70;
  Type TStack_2c60;
  undefined4 uStack_2c5c;
  undefined1 local_2c58 [16];
  TriangleSplitterFactory local_2c48;
  size_t local_2c40 [63];
  Scene *local_2a48;
  ulong local_2a40 [63];
  ulong local_2848;
  ulong local_2840;
  size_t local_13f8 [633];
  
  local_2e70 = (avx *)CONCAT71(in_register_00000081,mblur);
  iter.mblur = SUB81(types,0);
  scene_local = (Scene *)this;
  iter.scene = (Scene *)this;
  iter.typemask = (GTypeMask)scene;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  sVar16 = *(size_t *)(this + 0x1d8);
  uVar20 = 0;
  Splitter.scene = (Scene *)&iter;
  for (sVar15 = 0; sVar16 != sVar15; sVar15 = sVar15 + 1) {
    sVar10 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::
             operator()((anon_class_8_1_4d25ca37 *)&Splitter,sVar15);
    uVar20 = uVar20 + sVar10;
  }
  local_2840 = uVar20;
  iVar9 = tbb::detail::d1::max_concurrency();
  uVar13 = uVar20 + 0x3ff >> 10;
  if ((ulong)(long)iVar9 < uVar13) {
    uVar13 = (long)iVar9;
  }
  uVar17 = 0x40;
  if (uVar13 < 0x40) {
    uVar17 = uVar13;
  }
  sVar16 = 0;
  uVar17 = uVar17 + (uVar17 == 0);
  local_2c48.scene = (Scene *)0x0;
  local_2a48 = (Scene *)0x0;
  uVar11 = uVar20 / uVar17;
  uVar13 = 1;
  uVar22 = 0;
  local_2848 = uVar17;
  while (uVar13 < uVar17) {
    sVar15 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::
             operator()((anon_class_8_1_4d25ca37 *)&Splitter,sVar16);
    uVar18 = (uVar13 + 1) * uVar20;
    uVar19 = 0;
    uVar14 = uVar22;
    for (; ((uVar22 = (uVar14 + sVar15) - uVar19, uVar19 < sVar15 && (uVar11 <= uVar22)) &&
           (uVar13 < uVar17)); uVar13 = uVar13 + 1) {
      local_2c40[uVar13 - 1] = sVar16;
      uVar19 = uVar19 + (uVar11 - uVar14);
      local_2a40[uVar13 - 1] = uVar19;
      uVar22 = uVar18 / local_2848;
      uVar18 = uVar18 + uVar20;
      uVar14 = uVar11;
      uVar17 = local_2848;
      uVar11 = uVar22;
    }
    sVar16 = sVar16 + 1;
  }
  primitiveArea.scene = (Scene **)0x7f8000007f800000;
  uStack_2d00 = (size_t *)0x7f8000007f800000;
  local_2cf8._0_8_ = (anon_class_8_1_a89d07ac *)0xff800000ff800000;
  local_2cf8._8_8_ = (size_t *)0xff800000ff800000;
  local_2ce8._0_8_ = (size_t *)0x7f8000007f800000;
  local_2ce8._8_8_ = (undefined8 *)0x7f8000007f800000;
  local_2cd8._0_8_ = 0xff800000ff800000;
  local_2cd8._8_8_ = 0xff800000ff800000;
  local_2c98 = &local_2e60;
  taskCount_1 = (size_t)&iter;
  split_primitive.Splitter = &local_2c48;
  local_2e60.scene = (Scene *)numPrimRefs;
  taskCount = uVar17;
  aStack_2c90._0_8_ = taskCount_1;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)&Splitter,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
       &split_primitive;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,uVar17,1,(anon_class_8_1_898bcfc2_conflict5 *)&pinfo,(task_group_context *)&Splitter)
  ;
  cVar8 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&Splitter);
  if (cVar8 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&Splitter);
    local_2cc8._8_8_ = SUB168(ZEXT816(0),4);
    pinfo.begin = 0;
    pinfo.end = local_2cc8._8_8_;
    psVar21 = local_13f8;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
         primitiveArea;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = uStack_2d00
    ;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
         local_2cf8._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
         local_2cf8._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
         local_2ce8._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
         local_2ce8._8_8_;
    for (uVar20 = 0;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             local_2cd8._0_8_,
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             local_2cd8._8_8_, uVar20 < taskCount; uVar20 = uVar20 + 1) {
      Splitter.scene = (Scene *)psVar21[-0x288];
      psVar21[-8] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
                    _0_8_;
      psVar21[-7] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
                    _8_8_;
      psVar21[-6] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
                    _0_8_;
      psVar21[-5] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
                    _8_8_;
      psVar21[-4] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _0_8_;
      psVar21[-3] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _8_8_;
      psVar21[-2] = local_2cd8._0_8_;
      psVar21[-1] = local_2cd8._8_8_;
      *psVar21 = pinfo.begin;
      psVar21[1] = pinfo.end;
      createPrimRefArray_presplit<embree::QuadMesh,_embree::avx::QuadSplitterFactory>::
      anon_class_1_0_00000001::operator()
                ((PrimInfo *)&split_primitive,(anon_class_1_0_00000001 *)&local_2e68,&pinfo,
                 (PrimInfo *)&Splitter);
      pinfo.begin = local_2e08;
      pinfo.end = sStack_2e00;
      psVar21 = psVar21 + 10;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
           split_primitive;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
           &taskCount;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
           &primitiveArea;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
           &taskCount_1;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           &local_2e68;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           &local_2c98;
      local_2cd8._0_8_ = local_2e18._0_8_;
      local_2cd8._8_8_ = local_2e18._8_8_;
    }
    if ((avx *)(pinfo.end - pinfo.begin) != local_2e70) {
      (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
      uVar20 = local_2848;
      local_2c98 = (TriangleSplitterFactory *)0x7f8000007f800000;
      aStack_2c90._0_8_ = (Iterator2 *)0x7f8000007f800000;
      aStack_2c90.m128[2] = -INFINITY;
      aStack_2c90.m128[3] = -INFINITY;
      aStack_2c80.m128[0] = -INFINITY;
      aStack_2c80.m128[1] = -INFINITY;
      aStack_2c80.m128[2] = INFINITY;
      aStack_2c80.m128[3] = INFINITY;
      aStack_2c70.m128[0] = INFINITY;
      aStack_2c70.m128[1] = INFINITY;
      aStack_2c70.m128[2] = -INFINITY;
      aStack_2c70.m128[3] = -INFINITY;
      TStack_2c60 = 0xff800000;
      uStack_2c5c = 0xff800000;
      local_2c58 = ZEXT816(0) << 0x20;
      local_2e60.scene = (Scene *)&iter;
      taskCount_1 = local_2848;
      split_primitive.Splitter = &local_2c48;
      local_2e68 = numPrimRefs;
      taskCount = (size_t)&local_2e68;
      local_2e50 = local_2e60.scene;
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&Splitter,(context_traits)0x4,CUSTOM_CTX);
      primitiveArea.scene = (Scene **)&split_primitive;
      tbb::detail::d1::
      parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
                (0,uVar20,1,(anon_class_8_1_898bcfc2_conflict5 *)&primitiveArea,
                 (task_group_context *)&Splitter);
      cVar8 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&Splitter);
      if (cVar8 != '\0') {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar12,"task cancelled");
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&Splitter);
      local_2cc8 = local_2c58;
      psVar21 = local_13f8;
      primitiveArea.scene = (Scene **)local_2c98;
      uVar1 = aStack_2c90._0_8_;
      puVar2 = (undefined8 *)CONCAT44(aStack_2c90.m128[3],aStack_2c90.m128[2]);
      pTVar3 = (TriangleSplitterFactory *)CONCAT44(aStack_2c80.m128[1],aStack_2c80.m128[0]);
      puVar4 = (undefined1 *)CONCAT44(aStack_2c80.m128[3],aStack_2c80.m128[2]);
      psVar5 = (size_t *)CONCAT44(aStack_2c70.m128[1],aStack_2c70.m128[0]);
      uVar6 = CONCAT44(aStack_2c70.m128[3],aStack_2c70.m128[2]);
      uVar7 = CONCAT44(uStack_2c5c,TStack_2c60);
      for (uVar20 = 0; uVar20 < taskCount_1; uVar20 = uVar20 + 1) {
        Splitter.scene = (Scene *)psVar21[-0x288];
        psVar21[-8] = (size_t)primitiveArea.scene;
        psVar21[-7] = uVar1;
        psVar21[-6] = (size_t)puVar2;
        psVar21[-5] = (size_t)pTVar3;
        psVar21[-4] = (size_t)puVar4;
        psVar21[-3] = (size_t)psVar5;
        psVar21[-2] = uVar6;
        psVar21[-1] = uVar7;
        *psVar21 = local_2cc8._0_8_;
        psVar21[1] = local_2cc8._8_8_;
        createPrimRefArray_presplit<embree::QuadMesh,_embree::avx::QuadSplitterFactory>::
        anon_class_1_0_00000001::operator()
                  ((PrimInfo *)&split_primitive,(anon_class_1_0_00000001 *)&stack0xffffffffffffd17f,
                   (PrimInfo *)&primitiveArea,(PrimInfo *)&Splitter);
        local_2cc8._8_8_ = sStack_2e00;
        local_2cc8._0_8_ = local_2e08;
        psVar21 = psVar21 + 10;
        primitiveArea.scene = (Scene **)split_primitive;
        uVar1 = (Iterator2 *)&taskCount_1;
        puVar2 = &local_2c98;
        pTVar3 = &local_2e60;
        puVar4 = &stack0xffffffffffffd17f;
        psVar5 = &taskCount;
        uVar6 = local_2e18._0_8_;
        uVar7 = local_2e18._8_8_;
      }
      pinfo.begin = local_2cc8._0_8_;
      pinfo.end = local_2cc8._8_8_;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
           primitiveArea.scene;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = uVar1;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = puVar2;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ = pTVar3;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ = puVar4;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ = psVar5;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ = uVar6;
      pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ = uVar7;
    }
    primitiveArea.scene = &scene_local;
    split_primitive.Splitter = &Splitter;
    Splitter.scene = (Scene *)this;
    createPrimRefArray_presplit<embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&,unsigned_int,embree::avx::SplittingGrid_const&,embree::PrimRef*,unsigned_int&)_1_,embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&)_1_,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>>
              (__return_storage_ptr__,local_2e70,numPrimRefs,
               (vector_t<embree::PrimRef,_embree::aligned_monitored_allocator<embree::PrimRef,_32UL>_>
                *)&pinfo,(PrimInfo *)&split_primitive,(anon_class_8_1_78f12065 *)&primitiveArea,
               in_stack_ffffffffffffd178);
    return __return_storage_ptr__;
  }
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar12,"task cancelled");
  __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfo createPrimRefArray_presplit(Scene* scene, Geometry::GTypeMask types, bool mblur, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);

      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
	  return mesh->createPrimRefArray(prims,r,k,(unsigned)geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
	      return mesh->createPrimRefArray(prims,r,base.size(),(unsigned)geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}


      SplitterFactory Splitter(scene);
        
      auto split_primitive = [&] (const PrimRef &prim,
                                  const unsigned int splitprims,
                                  const SplittingGrid& grid,
                                  PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                                  unsigned int& numSubPrims)
      {
         const auto splitter = Splitter(prim);
         splitPrimitive(splitter,prim,splitprims,grid,subPrims,numSubPrims);
      };
      
      auto primitiveArea = [&] (const PrimRef &ref) {
        const unsigned int geomID = ref.geomID();
        const unsigned int primID = ref.primID();
        return ((Mesh*)scene->get(geomID))->projectedPrimitiveArea(primID);
      };
      
      return createPrimRefArray_presplit(numPrimRefs,prims,pinfo,split_primitive,primitiveArea);
    }